

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

long __thiscall
duckdb::Interpolator<false>::Extract<long,long>(Interpolator<false> *this,long *dest,Vector *result)

{
  duckdb *pdVar1;
  long lVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  long result_1;
  long local_50;
  string local_48;
  
  pdVar1 = (duckdb *)*dest;
  if (this->CRN == this->FRN) {
    bVar3 = TryCast::Operation<long,long>((int64_t)pdVar1,&local_50,false);
    if (!bVar3) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_48,pdVar1,auVar4._8_8_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar3 = TryCast::Operation<long,long>((int64_t)pdVar1,&local_50,false);
    lVar2 = local_50;
    if (!bVar3) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_48,pdVar1,auVar4._8_8_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    pdVar1 = (duckdb *)dest[1];
    bVar3 = TryCast::Operation<long,long>((int64_t)pdVar1,&local_50,false);
    if (!bVar3) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_48,pdVar1,auVar4._8_8_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_50 = (long)((double)(local_50 - lVar2) *
                      (this->RN -
                      (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                     (double)lVar2);
  }
  return local_50;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}